

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryUriComponent
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,DecodeUriOptions options)

{
  kj *pkVar1;
  kj kVar2;
  kj *pkVar3;
  kj kVar4;
  char *pcVar5;
  kj *pkVar6;
  size_t sVar7;
  bool bVar8;
  kj *pkVar9;
  char cVar10;
  Vector<unsigned_char> local_58;
  EncodingResult<kj::Array<unsigned_char>_> *local_38;
  
  pcVar5 = text.ptr;
  bVar8 = false;
  local_38 = __return_storage_ptr__;
  pkVar3 = (kj *)_::HeapArrayDisposer::allocateImpl
                           (1,0,(size_t)(pcVar5 + ((uint)text.size_ & 1)),(_func_void_void_ptr *)0x0
                            ,(_func_void_void_ptr *)0x0);
  local_58.builder.endPtr = (uchar *)(pcVar5 + ((uint)text.size_ & 1) + (long)pkVar3);
  local_58.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.builder.ptr = (uchar *)pkVar3;
  local_58.builder.pos = (RemoveConst<unsigned_char> *)pkVar3;
  if (0 < (long)pcVar5) {
    pkVar9 = (kj *)(pcVar5 + (long)this);
    bVar8 = false;
    do {
      kVar4 = *this;
      if (kVar4 == (kj)0x25) {
        pkVar1 = this + 1;
        if (pkVar1 == pkVar9) {
          bVar8 = true;
          break;
        }
        kVar4 = *pkVar1;
        cVar10 = -0x30;
        if (((9 < (byte)((char)kVar4 - 0x30U)) && (cVar10 = -0x57, 5 < (byte)((char)kVar4 + 0x9fU)))
           && (cVar10 = -0x37, 5 < (byte)((char)kVar4 + 0xbfU))) {
          bVar8 = true;
          this = pkVar1;
          goto LAB_0033e10b;
        }
        kVar4 = (kj)(cVar10 + (char)kVar4);
        pkVar1 = this + 2;
        pkVar6 = pkVar9;
        if (pkVar1 == pkVar9) {
LAB_0033e0cb:
          bVar8 = true;
        }
        else {
          kVar2 = *pkVar1;
          cVar10 = -0x30;
          if (((9 < (byte)((char)kVar2 - 0x30U)) &&
              (cVar10 = -0x57, 5 < (byte)((char)kVar2 + 0x9fU))) &&
             (cVar10 = -0x37, pkVar6 = pkVar1, 5 < (byte)((char)kVar2 + 0xbfU))) goto LAB_0033e0cb;
          kVar4 = (kj)((char)kVar4 * '\x10' | cVar10 + (char)kVar2);
          pkVar6 = this + 3;
        }
        if (pkVar3 == (kj *)local_58.builder.endPtr) {
          sVar7 = ((long)pkVar3 - (long)local_58.builder.ptr) * 2;
          if (pkVar3 == (kj *)local_58.builder.ptr) {
            sVar7 = 4;
          }
          Vector<unsigned_char>::setCapacity(&local_58,sVar7);
          pkVar3 = (kj *)local_58.builder.pos;
        }
        *pkVar3 = kVar4;
        pkVar3 = (kj *)(local_58.builder.pos + 1);
        this = pkVar6;
        local_58.builder.pos = (RemoveConst<unsigned_char> *)pkVar3;
      }
      else {
        if ((((uint)text.size_ >> 8 & 1) == 0) || (kVar4 != (kj)0x2b)) {
          if (pkVar3 == (kj *)local_58.builder.endPtr) {
            sVar7 = ((long)pkVar3 - (long)local_58.builder.ptr) * 2;
            if (pkVar3 == (kj *)local_58.builder.ptr) {
              sVar7 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_58,sVar7);
            kVar4 = *this;
            pkVar3 = (kj *)local_58.builder.pos;
          }
          *pkVar3 = kVar4;
        }
        else {
          if (pkVar3 == (kj *)local_58.builder.endPtr) {
            sVar7 = ((long)pkVar3 - (long)local_58.builder.ptr) * 2;
            if (pkVar3 == (kj *)local_58.builder.ptr) {
              sVar7 = 4;
            }
            Vector<unsigned_char>::setCapacity(&local_58,sVar7);
            pkVar3 = (kj *)local_58.builder.pos;
          }
          *pkVar3 = (kj)0x20;
        }
        pkVar3 = (kj *)local_58.builder.pos + 1;
        this = this + 1;
        local_58.builder.pos = (RemoveConst<unsigned_char> *)pkVar3;
      }
LAB_0033e10b:
    } while (this < pkVar9);
  }
  if (((undefined1  [16])text & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (pkVar3 == (kj *)local_58.builder.endPtr) {
      sVar7 = 4;
      if (local_58.builder.endPtr != local_58.builder.ptr) {
        sVar7 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
      }
      Vector<unsigned_char>::setCapacity(&local_58,sVar7);
      pkVar3 = (kj *)local_58.builder.pos;
    }
    *pkVar3 = (kj)0x0;
    pkVar3 = (kj *)(local_58.builder.pos + 1);
    local_58.builder.pos = (RemoveConst<unsigned_char> *)pkVar3;
  }
  if (pkVar3 != (kj *)local_58.builder.endPtr) {
    Vector<unsigned_char>::setCapacity(&local_58,(long)pkVar3 - (long)local_58.builder.ptr);
    local_58.builder.endPtr = local_58.builder.pos;
  }
  (local_38->super_Array<unsigned_char>).ptr = local_58.builder.ptr;
  (local_38->super_Array<unsigned_char>).size_ =
       (long)local_58.builder.endPtr - (long)local_58.builder.ptr;
  (local_38->super_Array<unsigned_char>).disposer = local_58.builder.disposer;
  local_38->hadErrors = bVar8;
  return local_38;
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryUriComponent(
    ArrayPtr<const char> text, DecodeUriOptions options) {
  Vector<byte> result(text.size() + options.nulTerminate);
  bool hadErrors = false;

  const char* ptr = text.begin();
  const char* end = text.end();
  while (ptr < end) {
    if (*ptr == '%') {
      ++ptr;

      if (ptr == end) {
        hadErrors = true;
      } else KJ_IF_MAYBE(d1, tryFromHexDigit(*ptr)) {
        byte b = *d1;
        ++ptr;
        if (ptr == end) {
          hadErrors = true;
        } else KJ_IF_MAYBE(d2, tryFromHexDigit(*ptr)) {
          b = (b << 4) | *d2;
          ++ptr;
        } else {
          hadErrors = true;
        }
        result.add(b);
      } else {
        hadErrors = true;
      }
    } else if (options.plusToSpace && *ptr == '+') {
      ++ptr;
      result.add(' ');
    } else {
      result.add(*ptr++);
    }
  }